

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

int __thiscall CGlyphMap::CAtlas::TrySection(CAtlas *this,int Index,int Width,int Height)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  vector3_base<int> *pvVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  array<vector3_base<int>,_allocator_default<vector3_base<int>_>_> *in_RDI;
  long in_FS_OFFSET;
  int i;
  int FitWidth;
  int CurY;
  int CurX;
  ivec3 Section;
  int local_3c;
  int local_38;
  int local_34;
  int local_18;
  int local_14;
  int iStack_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar6 = array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::operator[]
                     (in_RDI,in_ESI);
  uVar1 = pvVar6->field_0;
  uVar3 = pvVar6->field_1;
  local_34 = uVar3;
  local_3c = in_ESI;
  local_38 = in_EDX;
  if (*(int *)((long)&in_RDI[1].list + 4) + -1 < uVar1 + in_EDX) {
    local_18 = -1;
  }
  else {
    for (; (iVar5 = array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::size(in_RDI),
           local_3c < iVar5 && (0 < local_38)); local_38 = local_38 - (pvVar6->field_2).z) {
      pvVar6 = array<vector3_base<int>,_allocator_default<vector3_base<int>_>_>::operator[]
                         (in_RDI,local_3c);
      uVar4 = pvVar6->field_1;
      if (local_34 < (int)uVar4) {
        local_34 = uVar4;
      }
      if (in_RDI[1].list_size + -1 < local_34 + in_ECX) {
        local_18 = -1;
        goto LAB_0013f808;
      }
      local_3c = local_3c + 1;
    }
    local_18 = local_34;
  }
LAB_0013f808:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

int CGlyphMap::CAtlas::TrySection(int Index, int Width, int Height)
{
	ivec3 Section = m_Sections[Index];
	int CurX = Section.x;
	int CurY = Section.y;

	int FitWidth = Width;

	if(CurX + Width > m_Width - 1)
		return -1;

	for(int i = Index; i < m_Sections.size(); ++i)
	{
		if(FitWidth <= 0)
			break;

		Section = m_Sections[i];
		if(Section.y > CurY)
			CurY = Section.y;
		if(CurY + Height > m_Height - 1)
			return -1;
		FitWidth -= Section.l;
	}

	return CurY;
}